

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall
ON_2dVector::Decompose(ON_2dVector *this,ON_2dVector *X,ON_2dVector *Y,double *a,double *b)

{
  int iVar1;
  double m01;
  double m00;
  double m10;
  double d0;
  double d1;
  double XoY;
  double pivot_ratio;
  double *pdStack_30;
  int rank;
  double *b_local;
  double *a_local;
  ON_2dVector *Y_local;
  ON_2dVector *X_local;
  ON_2dVector *this_local;
  
  XoY = 0.0;
  pdStack_30 = b;
  b_local = a;
  a_local = &Y->x;
  Y_local = X;
  X_local = this;
  m01 = operator*(X,Y);
  m00 = operator*(Y_local,Y_local);
  m10 = operator*((ON_2dVector *)a_local,(ON_2dVector *)a_local);
  d0 = operator*(this,Y_local);
  d1 = operator*(this,(ON_2dVector *)a_local);
  iVar1 = ON_Solve2x2(m00,m01,m10,m01,d0,d1,b_local,pdStack_30,&XoY);
  return (bool)(-(iVar1 == 2) & 1);
}

Assistant:

bool ON_2dVector::Decompose( // Computes a, b such that this vector = a*X + b*Y
       //
       // If X,Y is known to be an orthonormal frame,
       // then a = V*X, b = V*Y will compute
       // the same result more quickly.
       const ON_2dVector& X,
       const ON_2dVector& Y,
       double* a,
       double* b
       ) const
{
  int rank;
  double pivot_ratio = 0.0;
  double XoY = X*Y;
  rank = ON_Solve2x2( X*X, XoY, Y*Y, XoY,
                    (*this)*X, (*this)*Y, 
                    a, b, &pivot_ratio );
  return (rank == 2) ? true : false;
}